

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SecretManager::RegisterSecretFunction
          (SecretManager *this,CreateSecretFunction *function,OnCreateConflict on_conflict)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_c0;
  CreateSecretFunction local_b0;
  
  local_c0._M_device = &this->manager_lock;
  local_c0._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_c0);
  local_c0._M_owns = true;
  paVar2 = &local_b0.secret_type.field_2;
  local_b0.secret_type._M_dataplus._M_p = (function->secret_type)._M_dataplus._M_p;
  paVar1 = &(function->secret_type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.secret_type._M_dataplus._M_p == paVar1) {
    local_b0.secret_type.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b0.secret_type.field_2._8_4_ = *(undefined4 *)((long)&(function->secret_type).field_2 + 8)
    ;
    local_b0.secret_type.field_2._12_4_ =
         *(undefined4 *)((long)&(function->secret_type).field_2 + 0xc);
    local_b0.secret_type._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.secret_type.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_b0.secret_type._M_string_length = (function->secret_type)._M_string_length;
  paVar3 = &local_b0.provider.field_2;
  (function->secret_type)._M_dataplus._M_p = (pointer)paVar1;
  (function->secret_type)._M_string_length = 0;
  (function->secret_type).field_2._M_local_buf[0] = '\0';
  local_b0.provider._M_dataplus._M_p = (function->provider)._M_dataplus._M_p;
  paVar1 = &(function->provider).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.provider._M_dataplus._M_p == paVar1) {
    local_b0.provider.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b0.provider.field_2._8_4_ = *(undefined4 *)((long)&(function->provider).field_2 + 8);
    local_b0.provider.field_2._12_4_ = *(undefined4 *)((long)&(function->provider).field_2 + 0xc);
    local_b0.provider._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_b0.provider.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_b0.provider._M_string_length = (function->provider)._M_string_length;
  (function->provider)._M_dataplus._M_p = (pointer)paVar1;
  (function->provider)._M_string_length = 0;
  (function->provider).field_2._M_local_buf[0] = '\0';
  local_b0.function = function->function;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_b0.named_parameters._M_h,&function->named_parameters,
               &function->named_parameters);
  RegisterSecretFunctionInternal(this,&local_b0,on_conflict);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b0.named_parameters._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.provider._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0.provider._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.secret_type._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0.secret_type._M_dataplus._M_p);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_c0);
  return;
}

Assistant:

void SecretManager::RegisterSecretFunction(CreateSecretFunction function, OnCreateConflict on_conflict) {
	unique_lock<mutex> lck(manager_lock);
	RegisterSecretFunctionInternal(std::move(function), on_conflict);
}